

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::TrackNoImplicitCallInlinees(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  Instr *instr_local;
  BackwardPass *this_local;
  
  if ((this->tag != DeadStorePhase) || (bVar2 = IsPrePass(this), bVar2)) {
    return false;
  }
  bVar2 = IR::Instr::HasBailOutInfo(instr);
  if (((!bVar2) &&
      (((bVar2 = OpCodeAttr::CallInstr(instr->m_opcode), !bVar2 &&
        (bVar2 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0), !bVar2)) &&
       (bVar2 = GlobOpt::MayNeedBailOnImplicitCall(instr,(Value *)0x0,(Value *)0x0), !bVar2)))) &&
     ((bVar2 = IR::Instr::HasAnyLoadHeapArgsOpCode(instr), !bVar2 && (instr->m_opcode != LdFuncExpr)
      ))) {
    if (instr->m_opcode != InlineeStart) {
      return false;
    }
    pOVar4 = IR::Instr::GetSrc1(instr);
    if (pOVar4 == (Opnd *)0x0) {
      if ((*(uint *)&instr->m_func->field_0x240 >> 1 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1fec,"(instr->m_func->m_hasInlineArgsOpt)",
                           "instr->m_func->m_hasInlineArgsOpt");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      return false;
    }
    bVar2 = ProcessInlineeStart(this,instr);
    return bVar2;
  }
  if (instr->m_opcode == InlineeStart) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1fe3,"(instr->m_opcode != Js::OpCode::InlineeStart)",
                       "instr->m_opcode != Js::OpCode::InlineeStart");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Func::SetHasImplicitCallsOnSelfAndParents(instr->m_func);
  return false;
}

Assistant:

bool
BackwardPass::TrackNoImplicitCallInlinees(IR::Instr *instr)
{
    if (this->tag != Js::DeadStorePhase || this->IsPrePass())
    {
        return false;
    }

    if (instr->HasBailOutInfo()
        || OpCodeAttr::CallInstr(instr->m_opcode)
        || instr->CallsAccessor()
        || GlobOpt::MayNeedBailOnImplicitCall(instr, nullptr, nullptr)
        || instr->HasAnyLoadHeapArgsOpCode()
        || instr->m_opcode == Js::OpCode::LdFuncExpr)
    {
        // This func has instrs with bailouts or implicit calls
        Assert(instr->m_opcode != Js::OpCode::InlineeStart);
        instr->m_func->SetHasImplicitCallsOnSelfAndParents();
        return false;
    }

    if (instr->m_opcode == Js::OpCode::InlineeStart)
    {
        if (!instr->GetSrc1())
        {
            Assert(instr->m_func->m_hasInlineArgsOpt);
            return false;
        }
        return this->ProcessInlineeStart(instr);
    }

    return false;
}